

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O1

int fres(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector rr,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = *user_data;
  pdVar4 = *(double **)((long)yy->content + 0x10);
  dVar1 = *pdVar4;
  dVar2 = **(double **)((long)yp->content + 0x10);
  dVar3 = pdVar4[1];
  dVar5 = exp(t);
  **(double **)((long)rr->content + 0x10) =
       (dVar5 + dVar5 + (dVar6 + -1.0) * dVar3 + (((1.0 - dVar6) / (t + -2.0)) * dVar1 - dVar1)) -
       dVar2;
  dVar6 = exp(t);
  *(double *)(*(long *)((long)rr->content + 0x10) + 8) = (t + 2.0) * dVar1 - dVar6 * (t + 2.0);
  return 0;
}

Assistant:

int fres(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector rr, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype alpha = rdata[0]; /* set shortcut for stiffness parameter */
  sunrealtype x1    = NV_Ith_S(yy, 0); /* access current solution values */
  sunrealtype x2    = NV_Ith_S(yy, 1);
  sunrealtype x1p   = NV_Ith_S(yp, 0); /* access current derivative values */
  sunrealtype ONE   = SUN_RCONST(1.0);
  sunrealtype TWO   = SUN_RCONST(2.0);

  NV_Ith_S(rr, 0) = (ONE - alpha) / (t - TWO) * x1 - x1 + (alpha - ONE) * x2 +
                    TWO * exp(t) - x1p;
  NV_Ith_S(rr, 1) = (t + TWO) * x1 - (t + TWO) * SUNRexp(t);

  return (0);
}